

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PolyVertexClipTestGroup::init
          (PolyVertexClipTestGroup *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  PolyVertexClipTestGroup *pPVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  TestCaseGroup *pTVar7;
  TestCaseGroup *pTVar8;
  TestNode *pTVar9;
  Vector<int,_3> *v;
  long lVar10;
  Vector<int,_3> *pVVar11;
  ulong uVar12;
  bool *pbVar13;
  long lVar14;
  bool *__rhs;
  Vector<int,_3> *pVVar15;
  int iVar16;
  float fVar17;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  float extraout_XMM0_Dd_00;
  allocator<char> local_4a9;
  Vector<long,_3> normalDir;
  Vector<long,_3> d1;
  undefined1 local_468 [8];
  float local_460;
  float fStack_45c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  IVec3 r2_2;
  Vector<long,_3> d2;
  Vector<long,_3> pfixed;
  undefined1 local_3f8 [8];
  float local_3f0;
  float local_3ec;
  undefined8 local_3d8;
  PolyVertexClipTestGroup *local_3c8;
  Vector<int,_3> *local_3c0;
  Vector<int,_3> *local_3b8;
  TestCaseGroup *local_3b0;
  IVec3 r2_1;
  IVec3 r1;
  TriangleData triangle;
  undefined8 local_318;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  Vector<float,_4> local_2f8;
  Vector<int,_3> *local_2e8;
  long local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  Vec3 r2;
  float fStack_2bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  string name;
  Vector<float,_4> local_278;
  float local_268 [4];
  Vector<float,_4> local_258;
  undefined8 local_248;
  float fStack_240;
  float fStack_23c;
  TestCaseGroup *local_238;
  long local_230;
  Vector<float,_4> local_228;
  IVec3 r1_1;
  IVec3 r0;
  Random rnd;
  undefined1 local_1e8 [12];
  float local_1dc;
  undefined1 local_1c8 [12];
  float local_1bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [12];
  Vector<int,_3> VStack_15c;
  undefined1 auStack_150 [16];
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  GLint local_a8 [8];
  undefined1 *local_88;
  undefined8 uStack_80;
  undefined1 *local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  local_168._0_8_ = 0xffffffff;
  stack0xfffffffffffffea0 = 0x100000000;
  VStack_15c.m_data[1] = 0;
  VStack_15c.m_data[2] = 0;
  auStack_150._0_4_ = 0;
  auStack_150._4_4_ = 1;
  auStack_150._8_8_ = 0;
  uStack_140 = 0xffffffff;
  local_138 = 0;
  uStack_130 = 1;
  local_128 = 0xffffffff00000000;
  uStack_120 = 0xffffffffffffffff;
  local_118 = 0x100000000;
  uStack_110 = 0xffffffff;
  local_108 = &DAT_100000001;
  uStack_100 = 0xffffffff00000000;
  local_f8 = 1;
  uStack_f0 = 0xffffffff;
  local_e8 = 0x1ffffffff;
  uStack_e0 = 0xffffffff00000000;
  local_d8 = 1;
  uStack_d0 = 0xffffffff00000001;
  local_c8 = 0x100000000;
  uStack_c0 = 0xffffffff00000000;
  local_b8 = 0xffffffff;
  uStack_b0 = 0xffffffff00000001;
  local_a8[0] = 0;
  local_a8[1] = 1;
  local_a8[2] = 1;
  local_a8[3] = 0;
  local_a8[4] = -1;
  local_a8[5] = 1;
  local_a8[6] = -1;
  local_a8[7] = -1;
  local_88 = &DAT_100000001;
  uStack_80 = 0x1ffffffff;
  local_78 = &DAT_100000001;
  uStack_70 = 0xffffffff00000001;
  local_68 = 1;
  uStack_64 = 1;
  uStack_60 = 0xffffffff;
  uStack_5c = 0xffffffff;
  local_58 = 0x1ffffffff;
  uStack_50 = 0xffffffffffffffff;
  local_48 = 1;
  uStack_44 = 1;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_38 = 0xffffffff00000001;
  deRandom_init(&rnd.m_rnd,0xabcdef);
  local_3d8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_3d8,(this->super_TestCaseGroup).m_context,"clip_one","Clip one vertex");
  pTVar7 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar7,(this->super_TestCaseGroup).m_context,"clip_two","Clip two vertices");
  pTVar8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar8,(this->super_TestCaseGroup).m_context,"clip_three","Clip three vertices");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_3d8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
  local_3c8 = this;
  local_238 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar8);
  for (lVar14 = 8; lVar14 != 0x140; lVar14 = lVar14 + 0xc) {
    local_308 = deRandom_getFloat(&rnd.m_rnd);
    fStack_304 = extraout_XMM0_Db;
    fStack_300 = extraout_XMM0_Dc;
    fStack_2fc = extraout_XMM0_Dd;
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    local_318 = (Vector<int,_3> *)CONCAT44(extraout_XMM0_Db_00,fVar17);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    pfixed.m_data[0] = 0x3f8000003f800000;
    pfixed.m_data[1] = 0x3f8000003f800000;
    triangle.p0.m_data[0] = (float)(int)*(undefined8 *)(local_168 + lVar14 + -8);
    triangle.p0.m_data[1] = (float)(int)((ulong)*(undefined8 *)(local_168 + lVar14 + -8) >> 0x20);
    triangle.p0.m_data[2] = (float)*(int *)(local_168 + lVar14);
    tcu::operator*((tcu *)&r2,30000.0,(Vector<float,_3> *)&triangle);
    local_3ec = fVar17 * 15.8 + 0.2;
    fStack_45c = (float)local_318 * 15.8 + 0.2;
    fVar17 = local_308 * 15.8 + 0.2;
    normalDir.m_data[0] = CONCAT44(fVar17 * 0.3,fVar17 * 0.2);
    normalDir.m_data[1] = CONCAT44(fVar17,fVar17 * 0.0);
    local_460 = fStack_45c * 0.0;
    local_468 = (undefined1  [8])CONCAT44(fStack_45c * -0.4,fStack_45c * -0.3);
    local_3f0 = r2.m_data[2] * local_3ec;
    local_3f8 = (undefined1  [8])CONCAT44(local_3ec * r2.m_data[1],local_3ec * r2.m_data[0]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&d2,"clip",(allocator<char> *)&local_188);
    pbVar13 = glcts::fixed_sample_locations_values + 1;
    if (*(int *)(local_168 + lVar14 + -8) < 0) {
      pbVar13 = (bool *)0x1811cae;
    }
    if (0 < *(int *)(local_168 + lVar14 + -8)) {
      pbVar13 = (bool *)0x1811c96;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d2,pbVar13)
    ;
    pbVar13 = glcts::fixed_sample_locations_values + 1;
    if (*(int *)(local_168 + lVar14 + -4) < 0) {
      pbVar13 = (bool *)0x1811dce;
    }
    if (0 < *(int *)(local_168 + lVar14 + -4)) {
      pbVar13 = (bool *)0x1811db8;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&triangle,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d1,pbVar13)
    ;
    pbVar13 = glcts::fixed_sample_locations_values + 1;
    if (*(int *)(local_168 + lVar14) < 0) {
      pbVar13 = (bool *)0x1811da2;
    }
    if (0 < *(int *)(local_168 + lVar14)) {
      pbVar13 = (bool *)0x1811d7b;
    }
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &triangle,pbVar13);
    std::__cxx11::string::~string((string *)&triangle);
    std::__cxx11::string::~string((string *)&d1);
    std::__cxx11::string::~string((string *)&d2);
    tcu::Vector<float,_4>::Vector(&triangle.p0,(Vector<float,_4> *)&normalDir);
    tcu::Vector<float,_4>::Vector(&triangle.c0,(Vector<float,_4> *)&pfixed);
    tcu::Vector<float,_4>::Vector(&triangle.p1,(Vector<float,_4> *)local_468);
    tcu::Vector<float,_4>::Vector(&triangle.c1,(Vector<float,_4> *)&pfixed);
    tcu::Vector<float,_4>::Vector(&triangle.p2,(Vector<float,_4> *)local_3f8);
    tcu::Vector<float,_4>::Vector(&triangle.c2,(Vector<float,_4> *)&pfixed);
    if ((*(int *)(local_168 + lVar14 + -8) != 0) || (*(int *)(local_168 + lVar14 + -4) != 0)) {
      pTVar9 = (TestNode *)operator_new(0xa0);
      TriangleCase::TriangleCase
                ((TriangleCase *)pTVar9,(local_3c8->super_TestCaseGroup).m_context,
                 name._M_dataplus._M_p,"clip one vertex",&triangle,(TriangleData *)&local_318,
                 (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
      tcu::TestNode::addChild((TestNode *)local_3d8,pTVar9);
    }
    std::__cxx11::string::~string((string *)&name);
  }
  d1.m_data[0] = 0x3f8000003f800000;
  d1.m_data[1] = 0x3f8000003f800000;
  triangle.p0.m_data[0] = 0.0;
  triangle.p0.m_data[1] = -0.7;
  triangle.p0.m_data[2] = -0.9;
  triangle.p0.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&triangle.c0,(Vector<float,_4> *)&d1);
  triangle.p1.m_data[0] = 0.8;
  triangle.p1.m_data[1] = 0.0;
  triangle.p1.m_data[2] = -0.7;
  triangle.p1.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&triangle.c1,(Vector<float,_4> *)&d1);
  triangle.p2.m_data[0] = -0.9;
  triangle.p2.m_data[1] = 0.9;
  triangle.p2.m_data[2] = 3.0;
  triangle.p2.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&triangle.c2,(Vector<float,_4> *)&d1);
  name._M_dataplus._M_p = (pointer)0xbf33333300000000;
  name._M_string_length = 0x3f8000003f666666;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&name.field_2,(Vector<float,_4> *)&d1);
  tcu::Vector<float,_4>::Vector(&local_278,(Vector<float,_4> *)&d1);
  local_268[0] = -0.9;
  local_268[1] = 0.9;
  local_268[2] = -3.0;
  local_268[3] = 1.0;
  tcu::Vector<float,_4>::Vector(&local_258,(Vector<float,_4> *)&d1);
  pTVar9 = (TestNode *)operator_new(0xa0);
  pPVar2 = local_3c8;
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar9,(local_3c8->super_TestCaseGroup).m_context,"clip_pos_z",
             "clip one vertex",&triangle,(TriangleData *)&local_318,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)local_3d8,pTVar9);
  pTVar9 = (TestNode *)operator_new(0xa0);
  TriangleCase::TriangleCase
            ((TriangleCase *)pTVar9,(pPVar2->super_TestCaseGroup).m_context,"clip_neg_z",
             "clip one vertex",(TriangleData *)&name,(TriangleData *)&local_248,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  tcu::TestNode::addChild((TestNode *)local_3d8,pTVar9);
  local_3b0 = (TestCaseGroup *)0x19;
  pVVar11 = &VStack_15c;
  local_3c0 = (Vector<int,_3> *)0x0;
  while (local_3c0 != (Vector<int,_3> *)0x1a) {
    lVar14 = (long)local_3c0 * 0xc;
    local_3c0 = (Vector<int,_3> *)((long)local_3c0 + 1);
    local_248 = (Vector<int,_3> *)(local_168 + lVar14);
    pTVar8 = local_3b0;
    local_3b8 = pVVar11;
    while (pTVar8 != (TestCaseGroup *)0x0) {
      local_3d8 = (TestCaseGroup *)((long)&pTVar8[-1].m_context + 7);
      fVar17 = deRandom_getFloat(&rnd.m_rnd);
      fStack_304 = extraout_var._0_4_;
      fStack_300 = extraout_var._4_4_;
      fStack_2fc = extraout_var._8_4_;
      local_308 = fVar17 * 15.8 + 0.2;
      fVar17 = deRandom_getFloat(&rnd.m_rnd);
      local_318 = (Vector<int,_3> *)CONCAT44(extraout_XMM0_Db_01,fVar17 * 15.8 + 0.2);
      fVar17 = deRandom_getFloat(&rnd.m_rnd);
      pVVar15 = local_248;
      fVar17 = fVar17 * 15.8 + 0.2;
      local_1a8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
      local_1a8._M_string_length = 0x3f8000003f800000;
      tcu::Vector<int,_3>::Vector(&r1,local_248);
      tcu::Vector<int,_3>::Vector(&r2_1,pVVar11);
      local_1c8._8_4_ = local_308 * 0.0;
      local_1c8._0_8_ = CONCAT44(local_308 * 0.3,local_308 * 0.2);
      local_1bc = local_308;
      local_1e8._8_4_ = (float)r1.m_data[2] * 30000.0 * (float)local_318;
      local_1e8._0_8_ =
           CONCAT44((float)local_318 * (float)r1.m_data[1] * 30000.0,
                    (float)local_318 * (float)r1.m_data[0] * 30000.0);
      local_1dc = (float)local_318;
      local_2f8.m_data[1] = fVar17 * (float)r2_1.m_data[1] * 30000.0;
      local_2f8.m_data[0] = fVar17 * (float)r2_1.m_data[0] * 30000.0;
      local_2f8.m_data[3] = fVar17;
      local_2f8.m_data[2] = (float)r2_1.m_data[2] * 30000.0 * fVar17;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3f8,"clip",(allocator<char> *)&r2);
      __rhs = glcts::fixed_sample_locations_values + 1;
      pbVar13 = glcts::fixed_sample_locations_values + 1;
      if (pVVar15->m_data[0] < 0) {
        pbVar13 = (bool *)0x1811cae;
      }
      if (0 < pVVar15->m_data[0]) {
        pbVar13 = (bool *)0x1811c96;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                     pbVar13);
      pbVar13 = glcts::fixed_sample_locations_values + 1;
      if (pVVar15->m_data[1] < 0) {
        pbVar13 = (bool *)0x1811dce;
      }
      if (0 < pVVar15->m_data[1]) {
        pbVar13 = (bool *)0x1811db8;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&normalDir
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468
                     ,pbVar13);
      if (pVVar15->m_data[2] < 0) {
        __rhs = (bool *)0x1811da2;
      }
      if (0 < pVVar15->m_data[2]) {
        __rhs = (bool *)0x1811d7b;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pfixed,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&normalDir
                     ,__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pfixed,
                     "_and");
      pbVar13 = glcts::fixed_sample_locations_values + 1;
      if (pVVar11->m_data[0] < 0) {
        pbVar13 = (bool *)0x1811cae;
      }
      if (0 < pVVar11->m_data[0]) {
        pbVar13 = (bool *)0x1811c96;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d2,
                     pbVar13);
      pbVar13 = glcts::fixed_sample_locations_values + 1;
      if (pVVar11->m_data[1] < 0) {
        pbVar13 = (bool *)0x1811dce;
      }
      if (0 < pVVar11->m_data[1]) {
        pbVar13 = (bool *)0x1811db8;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&triangle,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d1,
                     pbVar13);
      pbVar13 = glcts::fixed_sample_locations_values + 1;
      if (pVVar11->m_data[2] < 0) {
        pbVar13 = (bool *)0x1811da2;
      }
      if (0 < pVVar11->m_data[2]) {
        pbVar13 = (bool *)0x1811d7b;
      }
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &triangle,pbVar13);
      std::__cxx11::string::~string((string *)&triangle);
      std::__cxx11::string::~string((string *)&d1);
      std::__cxx11::string::~string((string *)&d2);
      std::__cxx11::string::~string((string *)&pfixed);
      std::__cxx11::string::~string((string *)&normalDir);
      std::__cxx11::string::~string((string *)local_468);
      std::__cxx11::string::~string((string *)local_3f8);
      tcu::Vector<float,_4>::Vector(&triangle.p0,(Vector<float,_4> *)local_1c8);
      tcu::Vector<float,_4>::Vector(&triangle.c0,(Vector<float,_4> *)&local_1a8);
      tcu::Vector<float,_4>::Vector(&triangle.p1,(Vector<float,_4> *)local_1e8);
      tcu::Vector<float,_4>::Vector(&triangle.c1,(Vector<float,_4> *)&local_1a8);
      tcu::Vector<float,_4>::Vector(&triangle.p2,&local_2f8);
      tcu::Vector<float,_4>::Vector(&triangle.c2,(Vector<float,_4> *)&local_1a8);
      d1.m_data[0] = (long)r1.m_data[0];
      d1.m_data[1] = (long)r1.m_data[1];
      d1.m_data[2] = (long)r1.m_data[2];
      d2.m_data[0] = (long)r2_1.m_data[0];
      d2.m_data[1] = (long)r2_1.m_data[1];
      d2.m_data[2] = (long)r2_1.m_data[2];
      pfixed.m_data[0] = 0xc;
      pfixed.m_data[1] = 0x13;
      pfixed.m_data[2] = 0;
      tcu::operator*((Vector<long,_3> *)local_3f8,0x400,&d1);
      tcu::operator-((Vector<long,_3> *)local_468,(Vector<long,_3> *)local_3f8,&pfixed);
      tcu::operator*((Vector<long,_3> *)&local_188,0x400,&d2);
      tcu::operator-((Vector<long,_3> *)&r2,(Vector<long,_3> *)&local_188,&pfixed);
      normalDir.m_data[0] =
           local_2b8._M_allocated_capacity * CONCAT44(fStack_45c,local_460) -
           local_458._M_allocated_capacity * CONCAT44(fStack_2bc,r2.m_data[2]);
      normalDir.m_data[1] =
           local_458._M_allocated_capacity * r2.m_data._0_8_ -
           local_2b8._M_allocated_capacity * (long)local_468;
      normalDir.m_data[2] =
           (long)local_468 * CONCAT44(fStack_2bc,r2.m_data[2]) -
           r2.m_data._0_8_ * CONCAT44(fStack_45c,local_460);
      lVar14 = tcu::lengthSquared<long,3>(&normalDir);
      if (-1 < lVar14 / -100 + normalDir.m_data[2] * normalDir.m_data[2]) {
        pTVar9 = (TestNode *)operator_new(0xa0);
        TriangleCase::TriangleCase
                  ((TriangleCase *)pTVar9,(local_3c8->super_TestCaseGroup).m_context,
                   name._M_dataplus._M_p,"clip two vertices",&triangle,(TriangleData *)&local_318,
                   (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
        tcu::TestNode::addChild((TestNode *)pTVar7,pTVar9);
      }
      std::__cxx11::string::~string((string *)&name);
      pVVar11 = pVVar11 + 1;
      pTVar8 = local_3d8;
    }
    local_3b0 = (TestCaseGroup *)((long)&local_3b0[-1].m_context + 7);
    pVVar11 = local_3b8 + 1;
  }
  local_2d8 = 2;
  local_2e0 = 1;
  pVVar11 = (Vector<int,_3> *)auStack_150;
  lVar14 = 0;
  local_2e8 = pVVar11;
  while (lVar14 != 0x1a) {
    local_230 = lVar14 + 1;
    v = (Vector<int,_3> *)(local_168 + lVar14 * 0xc);
    local_3c0 = local_2e8;
    local_2d0 = local_2d8;
    pVVar11 = v;
    pVVar15 = (Vector<int,_3> *)local_2e0;
    while (pVVar15 != (Vector<int,_3> *)0x1a) {
      lVar10 = (long)pVVar15 * 0xc;
      pVVar15 = (Vector<int,_3> *)((long)pVVar15 + 1);
      local_3b0 = (TestCaseGroup *)(local_168 + lVar10);
      pVVar11 = local_3c0;
      local_3b8 = pVVar15;
      for (uVar12 = local_2d0; uVar12 < 0x1a; uVar12 = uVar12 + 1) {
        fVar17 = deRandom_getFloat(&rnd.m_rnd);
        fStack_240 = extraout_var_00._4_4_;
        fStack_23c = extraout_var_00._8_4_;
        local_248 = (Vector<int,_3> *)CONCAT44(extraout_var_00._0_4_,fVar17 * 15.8 + 0.2);
        fVar17 = deRandom_getFloat(&rnd.m_rnd);
        local_3d8 = (TestCaseGroup *)CONCAT44(extraout_XMM0_Db_02,fVar17 * 15.8 + 0.2);
        fVar17 = deRandom_getFloat(&rnd.m_rnd);
        local_308 = fVar17 * 15.8 + 0.2;
        local_2f8.m_data[0] = 1.0;
        local_2f8.m_data[1] = 1.0;
        local_2f8.m_data[2] = 1.0;
        local_2f8.m_data[3] = 1.0;
        fStack_304 = extraout_XMM0_Db_03;
        fStack_300 = extraout_XMM0_Dc_00;
        fStack_2fc = extraout_XMM0_Dd_00;
        tcu::Vector<int,_3>::Vector(&r0,v);
        tcu::Vector<int,_3>::Vector(&r1_1,(Vector<int,_3> *)local_3b0);
        local_318 = pVVar11;
        tcu::Vector<int,_3>::Vector(&r2_2,pVVar11);
        r1.m_data[2] = (int)((float)r0.m_data[2] * 30000.0 * (float)local_248);
        r1.m_data[1] = (int)((float)local_248 * (float)r0.m_data[1] * 30000.0);
        r1.m_data[0] = (int)((float)local_248 * (float)r0.m_data[0] * 30000.0);
        r2_1.m_data[2] = (int)((float)r1_1.m_data[2] * 30000.0 * (float)local_3d8);
        r2_1.m_data[1] = (int)((float)local_3d8 * (float)r1_1.m_data[1] * 30000.0);
        r2_1.m_data[0] = (int)((float)local_3d8 * (float)r1_1.m_data[0] * 30000.0);
        local_228.m_data[2] = (float)r2_2.m_data[2] * 30000.0 * local_308;
        local_228.m_data[1] = local_308 * (float)r2_2.m_data[1] * 30000.0;
        local_228.m_data[0] = local_308 * (float)r2_2.m_data[0] * 30000.0;
        local_228.m_data[3] = local_308;
        pfixed.m_data[0]._0_4_ = r0.m_data[0];
        pfixed.m_data[0]._4_4_ = r0.m_data[1];
        normalDir.m_data[0]._0_4_ = r1_1.m_data[0];
        normalDir.m_data[0]._4_4_ = r1_1.m_data[1];
        local_468._0_4_ = r2_2.m_data[0];
        local_468._4_4_ = r2_2.m_data[1];
        tcu::operator-((Vector<int,_2> *)&normalDir,(Vector<int,_2> *)&pfixed);
        fVar17 = triangle.p0.m_data[0];
        tcu::operator-((Vector<int,_2> *)local_468,(Vector<int,_2> *)&pfixed);
        iVar16 = (int)fVar17 * name._M_dataplus._M_p._4_4_;
        tcu::operator-((Vector<int,_2> *)local_468,(Vector<int,_2> *)&pfixed);
        iVar3 = (int)d1.m_data[0];
        tcu::operator-((Vector<int,_2> *)&normalDir,(Vector<int,_2> *)&pfixed);
        pVVar15 = local_3b8;
        if (iVar16 != iVar3 * d2.m_data[0]._4_4_) {
          r2.m_data[0] = 0.0;
          r2.m_data[1] = 0.0;
          r2.m_data[2] = 0.0;
          tcu::operator-((tcu *)&name,&r1_1,&r0);
          tcu::operator-((tcu *)&d1,&r2_2,&r0);
          triangle.p0.m_data[1] =
               (float)((int)name._M_string_length * (int)d1.m_data[0] -
                      (int)d1.m_data[1] * (int)name._M_dataplus._M_p);
          triangle.p0.m_data[0] =
               (float)((int)d1.m_data[1] * name._M_dataplus._M_p._4_4_ -
                      (int)name._M_string_length * d1.m_data[0]._4_4_);
          triangle.p0.m_data[2] =
               (float)((int)name._M_dataplus._M_p * d1.m_data[0]._4_4_ -
                      (int)d1.m_data[0] * name._M_dataplus._M_p._4_4_);
          tcu::operator-((tcu *)&name,(Vector<int,_3> *)&r2,&r0);
          iVar3 = tcu::dot<int,3>((Vector<int,_3> *)&triangle,(Vector<int,_3> *)&name);
          if (iVar3 == 0) {
            tcu::operator-((tcu *)&d2,&r1_1,&r0);
            tcu::operator-((tcu *)&pfixed,(Vector<int,_3> *)&r2,&r0);
            d1.m_data[0] = CONCAT44((int)d2.m_data[1] * (int)pfixed.m_data[0] -
                                    (int)pfixed.m_data[1] * (int)d2.m_data[0],
                                    (int)pfixed.m_data[1] * d2.m_data[0]._4_4_ -
                                    (int)d2.m_data[1] * pfixed.m_data[0]._4_4_);
            d1.m_data[1] = CONCAT44(d1.m_data[1]._4_4_,
                                    (int)d2.m_data[0] * pfixed.m_data[0]._4_4_ -
                                    (int)pfixed.m_data[0] * d2.m_data[0]._4_4_);
            iVar3 = tcu::dot<int,3>((Vector<int,_3> *)&triangle,(Vector<int,_3> *)&d1);
            iVar16 = iVar3 >> 0x1f;
            if (0 < iVar3) {
              iVar16 = 1;
            }
            tcu::operator-((tcu *)local_468,&r2_2,&r0);
            tcu::operator-((tcu *)local_3f8,(Vector<int,_3> *)&r2,&r0);
            normalDir.m_data[0] =
                 CONCAT44((int)local_460 * local_3f8._0_4_ - (int)local_3f0 * local_468._0_4_,
                          (int)local_3f0 * local_468._4_4_ - (int)local_460 * local_3f8._4_4_);
            normalDir.m_data[1] =
                 CONCAT44(normalDir.m_data[1]._4_4_,
                          local_468._0_4_ * local_3f8._4_4_ - local_3f8._0_4_ * local_468._4_4_);
            iVar4 = tcu::dot<int,3>((Vector<int,_3> *)&triangle,(Vector<int,_3> *)&normalDir);
            iVar3 = iVar4 >> 0x1f;
            if (0 < iVar4) {
              iVar3 = 1;
            }
            if (iVar16 != iVar3) {
              tcu::operator-((tcu *)&d2,&r2_2,&r1_1);
              tcu::operator-((tcu *)&pfixed,(Vector<int,_3> *)&r2,&r1_1);
              d1.m_data[0] = CONCAT44((int)d2.m_data[1] * (int)pfixed.m_data[0] -
                                      (int)pfixed.m_data[1] * (int)d2.m_data[0],
                                      (int)pfixed.m_data[1] * d2.m_data[0]._4_4_ -
                                      (int)d2.m_data[1] * pfixed.m_data[0]._4_4_);
              d1.m_data[1] = CONCAT44(d1.m_data[1]._4_4_,
                                      (int)d2.m_data[0] * pfixed.m_data[0]._4_4_ -
                                      (int)pfixed.m_data[0] * d2.m_data[0]._4_4_);
              iVar3 = tcu::dot<int,3>((Vector<int,_3> *)&triangle,(Vector<int,_3> *)&d1);
              iVar16 = iVar3 >> 0x1f;
              if (0 < iVar3) {
                iVar16 = 1;
              }
              tcu::operator-((tcu *)local_468,&r0,&r1_1);
              tcu::operator-((tcu *)local_3f8,(Vector<int,_3> *)&r2,&r1_1);
              normalDir.m_data[0] =
                   CONCAT44((int)local_460 * local_3f8._0_4_ - (int)local_3f0 * local_468._0_4_,
                            (int)local_3f0 * local_468._4_4_ - (int)local_460 * local_3f8._4_4_);
              normalDir.m_data[1] =
                   CONCAT44(normalDir.m_data[1]._4_4_,
                            local_468._0_4_ * local_3f8._4_4_ - local_3f8._0_4_ * local_468._4_4_);
              iVar4 = tcu::dot<int,3>((Vector<int,_3> *)&triangle,(Vector<int,_3> *)&normalDir);
              iVar3 = iVar4 >> 0x1f;
              if (0 < iVar4) {
                iVar3 = 1;
              }
              if (iVar16 != iVar3) {
                tcu::operator-((tcu *)&d2,&r0,&r2_2);
                tcu::operator-((tcu *)&pfixed,(Vector<int,_3> *)&r2,&r2_2);
                d1.m_data[0] = CONCAT44((int)d2.m_data[1] * (int)pfixed.m_data[0] -
                                        (int)pfixed.m_data[1] * (int)d2.m_data[0],
                                        (int)pfixed.m_data[1] * d2.m_data[0]._4_4_ -
                                        (int)d2.m_data[1] * pfixed.m_data[0]._4_4_);
                d1.m_data[1] = CONCAT44(d1.m_data[1]._4_4_,
                                        (int)d2.m_data[0] * pfixed.m_data[0]._4_4_ -
                                        (int)pfixed.m_data[0] * d2.m_data[0]._4_4_);
                uVar5 = tcu::dot<int,3>((Vector<int,_3> *)&triangle,(Vector<int,_3> *)&d1);
                tcu::operator-((tcu *)local_468,&r1_1,&r2_2);
                tcu::operator-((tcu *)local_3f8,(Vector<int,_3> *)&r2,&r2_2);
                normalDir.m_data[0] =
                     CONCAT44((int)local_460 * local_3f8._0_4_ - (int)local_3f0 * local_468._0_4_,
                              (int)local_3f0 * local_468._4_4_ - (int)local_460 * local_3f8._4_4_);
                normalDir.m_data[1] =
                     CONCAT44(normalDir.m_data[1]._4_4_,
                              local_468._0_4_ * local_3f8._4_4_ - local_3f8._0_4_ * local_468._4_4_)
                ;
                uVar6 = tcu::dot<int,3>((Vector<int,_3> *)&triangle,(Vector<int,_3> *)&normalDir);
                bVar1 = (int)uVar6 < 1;
                if ((int)uVar5 < 1) {
                  bVar1 = (int)(uVar6 ^ uVar5) < 0 || 0 < (int)uVar6;
                }
                if (bVar1) {
                  tcu::Vector<float,_4>::Vector(&triangle.p0,(Vector<float,_4> *)&r1);
                  tcu::Vector<float,_4>::Vector(&triangle.c0,&local_2f8);
                  tcu::Vector<float,_4>::Vector(&triangle.p1,(Vector<float,_4> *)&r2_1);
                  tcu::Vector<float,_4>::Vector(&triangle.c1,&local_2f8);
                  tcu::Vector<float,_4>::Vector(&triangle.p2,&local_228);
                  tcu::Vector<float,_4>::Vector(&triangle.c2,&local_2f8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_1e8,"clip",&local_4a9);
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (v->m_data[0] < 0) {
                    pbVar13 = (bool *)0x1811cae;
                  }
                  if (0 < v->m_data[0]) {
                    pbVar13 = (bool *)0x1811c96;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1e8,pbVar13);
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (*(int *)(local_168 + lVar14 * 0xc + 4) < 0) {
                    pbVar13 = (bool *)0x1811dce;
                  }
                  if (0 < *(int *)(local_168 + lVar14 * 0xc + 4)) {
                    pbVar13 = (bool *)0x1811db8;
                  }
                  std::operator+(&local_1a8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1c8,pbVar13);
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if ((&VStack_15c)[lVar14 + -1].m_data[2] < 0) {
                    pbVar13 = (bool *)0x1811da2;
                  }
                  if (0 < (&VStack_15c)[lVar14 + -1].m_data[2]) {
                    pbVar13 = (bool *)0x1811d7b;
                  }
                  std::operator+(&local_188,&local_1a8,pbVar13);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&r2,&local_188,"_and");
                  pTVar7 = local_3b0;
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (*(int *)&local_3b0->super_TestCaseGroup < 0) {
                    pbVar13 = (bool *)0x1811cae;
                  }
                  if (0 < *(int *)&local_3b0->super_TestCaseGroup) {
                    pbVar13 = (bool *)0x1811c96;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3f8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&r2,pbVar13);
                  iVar3 = *(int *)((long)&pTVar7->super_TestCaseGroup + 4);
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (iVar3 < 0) {
                    pbVar13 = (bool *)0x1811dce;
                  }
                  if (0 < iVar3) {
                    pbVar13 = (bool *)0x1811db8;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_468,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3f8,pbVar13);
                  iVar3 = *(int *)((long)&pTVar7->super_TestCaseGroup + 8);
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (iVar3 < 0) {
                    pbVar13 = (bool *)0x1811da2;
                  }
                  if (0 < iVar3) {
                    pbVar13 = (bool *)0x1811d7b;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&normalDir,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_468,pbVar13);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pfixed,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&normalDir,"_and");
                  pVVar11 = local_318;
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (local_318->m_data[0] < 0) {
                    pbVar13 = (bool *)0x1811cae;
                  }
                  if (0 < local_318->m_data[0]) {
                    pbVar13 = (bool *)0x1811c96;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&d2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&pfixed,pbVar13);
                  iVar3 = pVVar11->m_data[1];
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (iVar3 < 0) {
                    pbVar13 = (bool *)0x1811dce;
                  }
                  if (0 < iVar3) {
                    pbVar13 = (bool *)0x1811db8;
                  }
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&d1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&d2,pbVar13);
                  iVar3 = pVVar11->m_data[2];
                  pbVar13 = glcts::fixed_sample_locations_values + 1;
                  if (iVar3 < 0) {
                    pbVar13 = (bool *)0x1811da2;
                  }
                  if (0 < iVar3) {
                    pbVar13 = (bool *)0x1811d7b;
                  }
                  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&d1,pbVar13);
                  std::__cxx11::string::~string((string *)&d1);
                  std::__cxx11::string::~string((string *)&d2);
                  std::__cxx11::string::~string((string *)&pfixed);
                  std::__cxx11::string::~string((string *)&normalDir);
                  std::__cxx11::string::~string((string *)local_468);
                  std::__cxx11::string::~string((string *)local_3f8);
                  std::__cxx11::string::~string((string *)&r2);
                  std::__cxx11::string::~string((string *)&local_188);
                  std::__cxx11::string::~string((string *)&local_1a8);
                  std::__cxx11::string::~string((string *)local_1c8);
                  std::__cxx11::string::~string((string *)local_1e8);
                  pTVar9 = (TestNode *)operator_new(0xa0);
                  pVVar15 = local_3b8;
                  TriangleCase::TriangleCase
                            ((TriangleCase *)pTVar9,(local_3c8->super_TestCaseGroup).m_context,
                             name._M_dataplus._M_p,"clip three vertices",&triangle,
                             (TriangleData *)&local_318,
                             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
                  tcu::TestNode::addChild((TestNode *)local_238,pTVar9);
                  std::__cxx11::string::~string((string *)&name);
                }
              }
            }
          }
        }
        pVVar11 = local_318 + 1;
      }
      local_2d0 = local_2d0 + 1;
      local_3c0 = local_3c0 + 1;
    }
    local_2d8 = local_2d8 + 1;
    local_2e0 = local_2e0 + 1;
    local_2e8 = local_2e8 + 1;
    lVar14 = local_230;
  }
  return (int)pVVar11;
}

Assistant:

void PolyVertexClipTestGroup::init (void)
{
	const float far = 30000.0f;
	const tcu::IVec3 outside[] =
	{
		// outside one clipping plane
		tcu::IVec3(-1,  0,  0),
		tcu::IVec3( 1,  0,  0),
		tcu::IVec3( 0,  1,  0),
		tcu::IVec3( 0, -1,  0),
		tcu::IVec3( 0,  0,  1),
		tcu::IVec3( 0,  0, -1),

		// outside two clipping planes
		tcu::IVec3(-1, -1,  0),
		tcu::IVec3( 1, -1,  0),
		tcu::IVec3( 1,  1,  0),
		tcu::IVec3(-1,  1,  0),

		tcu::IVec3(-1,  0, -1),
		tcu::IVec3( 1,  0, -1),
		tcu::IVec3( 1,  0,  1),
		tcu::IVec3(-1,  0,  1),

		tcu::IVec3( 0, -1, -1),
		tcu::IVec3( 0,  1, -1),
		tcu::IVec3( 0,  1,  1),
		tcu::IVec3( 0, -1,  1),

		// outside three clipping planes
		tcu::IVec3(-1, -1,  1),
		tcu::IVec3( 1, -1,  1),
		tcu::IVec3( 1,  1,  1),
		tcu::IVec3(-1,  1,  1),

		tcu::IVec3(-1, -1, -1),
		tcu::IVec3( 1, -1, -1),
		tcu::IVec3( 1,  1, -1),
		tcu::IVec3(-1,  1, -1),
	};

	de::Random rnd(0xabcdef);

	TestCaseGroup* clipOne		= new TestCaseGroup(m_context, "clip_one",		"Clip one vertex");
	TestCaseGroup* clipTwo		= new TestCaseGroup(m_context, "clip_two",		"Clip two vertices");
	TestCaseGroup* clipThree	= new TestCaseGroup(m_context, "clip_three",	"Clip three vertices");

	addChild(clipOne);
	addChild(clipTwo);
	addChild(clipThree);

	// Test 1 point clipped
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(outside); ++ndx)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::Vec3 r1		= tcu::Vec3(-0.3f,	-0.4f,	0);
		const tcu::Vec3 r2		= IVec3ToVec3(outside[ndx]) * far;
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(r1.x() * w1, r1.y() * w1, r1.z() * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(r2.x() * w2, r2.y() * w2, r2.z() * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx].x() > 0 ? "_pos_x" : (outside[ndx].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx].y() > 0 ? "_pos_y" : (outside[ndx].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx].z() > 0 ? "_pos_z" : (outside[ndx].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		// don't try to test with degenerate (or almost degenerate) triangles
		if (outside[ndx].x() == 0 && outside[ndx].y() == 0)
			continue;

		clipOne->addChild(new TriangleCase(m_context, name.c_str(), "clip one vertex", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Special triangles for "clip_z" cases, default triangles is not good, since it has very small visible area => problems with MSAA
	{
		const tcu::Vec4 white = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

		const TriangleCase::TriangleData posZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f, -0.9f, 1.0f), white,
			tcu::Vec4( 0.8f,  0.0f, -0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f,  3.0f, 1.0f), white
		};
		const TriangleCase::TriangleData negZTriangle =
		{
			tcu::Vec4( 0.0f, -0.7f,  0.9f, 1.0f), white,
			tcu::Vec4( 0.4f,  0.0f,  0.7f, 1.0f), white,
			tcu::Vec4(-0.9f,  0.9f, -3.0f, 1.0f), white
		};

		clipOne->addChild(new TriangleCase(m_context, "clip_pos_z", "clip one vertex", &posZTriangle, &posZTriangle + 1, VIEWPORT_CENTER));
		clipOne->addChild(new TriangleCase(m_context, "clip_neg_z", "clip one vertex", &negZTriangle, &negZTriangle + 1, VIEWPORT_CENTER));
	}

	// Test 2 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(    1,	    1,	1,	1);
		const tcu::Vec3 r0		= tcu::Vec3( 0.2f,	 0.3f,	0);
		const tcu::IVec3 r1		= outside[ndx1];
		const tcu::IVec3 r2		= outside[ndx2];
		const tcu::Vec4 p0		= tcu::Vec4(r0.x() * w0, r0.y() * w0, r0.z() * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * far * w1, float(r1.y()) * far * w1, float(r1.z()) * far * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * far * w2, float(r2.y()) * far * w2, float(r2.z()) * far * w2, w2);

		const std::string name	= std::string("clip") +
			(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
			"_and" +
			(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
			(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
			(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : ""));

		const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};

		if (twoPointClippedTriangleInvisible(r0, r1, r2))
			continue;

		clipTwo->addChild(new TriangleCase(m_context, name.c_str(), "clip two vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
	}

	// Test 3 points clipped
	for (int ndx1 = 0; ndx1 < DE_LENGTH_OF_ARRAY(outside); ++ndx1)
	for (int ndx2 = ndx1 + 1; ndx2 < DE_LENGTH_OF_ARRAY(outside); ++ndx2)
	for (int ndx3 = ndx2 + 1; ndx3 < DE_LENGTH_OF_ARRAY(outside); ++ndx3)
	{
		const float		w0		= rnd.getFloat(0.2f, 16.0f);
		const float		w1		= rnd.getFloat(0.2f, 16.0f);
		const float		w2		= rnd.getFloat(0.2f, 16.0f);
		const tcu::Vec4 white	= tcu::Vec4(1, 1, 1, 1);
		const tcu::IVec3 r0		= outside[ndx1];
		const tcu::IVec3 r1		= outside[ndx2];
		const tcu::IVec3 r2		= outside[ndx3];
		const tcu::Vec4 p0		= tcu::Vec4(float(r0.x()) * far * w0, float(r0.y()) * far * w0, float(r0.z()) * far * w0, w0);
		const tcu::Vec4 p1		= tcu::Vec4(float(r1.x()) * far * w1, float(r1.y()) * far * w1, float(r1.z()) * far * w1, w1);
		const tcu::Vec4 p2		= tcu::Vec4(float(r2.x()) * far * w2, float(r2.y()) * far * w2, float(r2.z()) * far * w2, w2);

		// ignore cases where polygon is along xz or yz planes
		if (pointsOnLine(r0.swizzle(0, 1), r1.swizzle(0, 1), r2.swizzle(0, 1)))
			continue;

		// triangle is visible only if it intersects the origin
		if (pointOnTriangle(tcu::IVec3(0, 0, 0), r0, r1, r2))
		{
			const TriangleCase::TriangleData triangle =	{p0, white, p1, white, p2, white};
			const std::string name	= std::string("clip") +
				(outside[ndx1].x() > 0 ? "_pos_x" : (outside[ndx1].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx1].y() > 0 ? "_pos_y" : (outside[ndx1].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx1].z() > 0 ? "_pos_z" : (outside[ndx1].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx2].x() > 0 ? "_pos_x" : (outside[ndx2].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx2].y() > 0 ? "_pos_y" : (outside[ndx2].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx2].z() > 0 ? "_pos_z" : (outside[ndx2].z() < 0 ? "_neg_z" : "")) +
				"_and" +
				(outside[ndx3].x() > 0 ? "_pos_x" : (outside[ndx3].x() < 0 ? "_neg_x" : "")) +
				(outside[ndx3].y() > 0 ? "_pos_y" : (outside[ndx3].y() < 0 ? "_neg_y" : "")) +
				(outside[ndx3].z() > 0 ? "_pos_z" : (outside[ndx3].z() < 0 ? "_neg_z" : ""));

			clipThree->addChild(new TriangleCase(m_context, name.c_str(), "clip three vertices", &triangle, &triangle + 1, VIEWPORT_CENTER));
		}
	}
}